

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

void __thiscall pbrt::Vector3fi::Vector3fi(Vector3fi *this,Vector3f *p,Vector3f *e)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Interval<float> IVar3;
  Interval<float> IVar4;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar5 [64];
  undefined1 extraout_var [56];
  
  IVar3 = Interval<float>::FromValueAndError
                    ((p->super_Tuple3<pbrt::Vector3,_float>).x,
                     (e->super_Tuple3<pbrt::Vector3,_float>).x);
  IVar4 = Interval<float>::FromValueAndError
                    ((p->super_Tuple3<pbrt::Vector3,_float>).y,
                     (e->super_Tuple3<pbrt::Vector3,_float>).y);
  auVar5._0_8_ = Interval<float>::FromValueAndError
                           ((p->super_Tuple3<pbrt::Vector3,_float>).z,
                            (e->super_Tuple3<pbrt::Vector3,_float>).z);
  auVar5._8_56_ = extraout_var;
  auVar2._8_8_ = extraout_XMM0_Qb;
  auVar2._0_4_ = IVar3.low;
  auVar2._4_4_ = IVar3.high;
  auVar1._8_8_ = extraout_XMM0_Qb_00;
  auVar1._0_4_ = IVar4.low;
  auVar1._4_4_ = IVar4.high;
  auVar1 = vunpcklpd_avx(auVar2,auVar1);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.low = (float)(int)auVar1._0_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  x.high = (float)(int)((ulong)auVar1._0_8_ >> 0x20);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.low = (float)(int)auVar1._8_8_;
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  y.high = (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  IVar3 = (Interval<float>)vmovlps_avx(auVar5._0_16_);
  (this->super_Vector3<pbrt::Interval<float>_>).super_Tuple3<pbrt::Vector3,_pbrt::Interval<float>_>.
  z = IVar3;
  return;
}

Assistant:

PBRT_CPU_GPU
    Vector3fi(const Vector3f &p, const Vector3f &e)
        : Vector3<Interval<Float>>(Interval<Float>::FromValueAndError(p.x, e.x),
                                   Interval<Float>::FromValueAndError(p.y, e.y),
                                   Interval<Float>::FromValueAndError(p.z, e.z)) {}